

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmConditional(LlvmCompilationContext *ctx,ExprConditional *node)

{
  TypeBase *pTVar1;
  LLVMValueRef pLVar2;
  TypeBase *pTVar3;
  
  CompileLlvm(ctx,node->condition);
  pTVar1 = GetStackType(ctx,node->condition->type);
  CompileLlvmType(ctx,pTVar1);
  CompileLlvmType(ctx,(node->super_ExprBase).type);
  pLVar2 = CompileLlvm(ctx,node->trueBlock);
  pTVar1 = node->trueBlock->type;
  pTVar3 = GetStackType(ctx,pTVar1);
  ConvertToDataType(ctx,pLVar2,pTVar3,pTVar1);
  pLVar2 = CompileLlvm(ctx,node->falseBlock);
  pTVar1 = node->falseBlock->type;
  pTVar3 = GetStackType(ctx,pTVar1);
  ConvertToDataType(ctx,pLVar2,pTVar3,pTVar1);
  pLVar2 = ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,(node->super_ExprBase).type);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmConditional(LlvmCompilationContext &ctx, ExprConditional *node)
{
	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBasicBlockRef trueBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_true");
	LLVMBasicBlockRef falseBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_false");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_exit");

	LLVMValueRef result = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, node->type), "cond");

	LLVMBuildCondBr(ctx.builder, condition, trueBlock, falseBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, trueBlock);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, CompileLlvm(ctx, node->trueBlock), GetStackType(ctx, node->trueBlock->type), node->trueBlock->type), result);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, falseBlock);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, CompileLlvm(ctx, node->falseBlock), GetStackType(ctx, node->falseBlock->type), node->falseBlock->type), result);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, result, ""), node->type));
}